

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O3

void gray_record_cell(gray_PWorker worker)

{
  PCell pTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  long lVar9;
  PCell *ppTVar10;
  PCell_conflict pTVar11;
  PCell_conflict pTVar12;
  int iVar13;
  
  iVar8 = worker->ex;
  ppTVar10 = worker->ycells + ((long)worker->ey - (long)worker->min_ey);
  pTVar12 = *ppTVar10;
  if (pTVar12 == (PCell_conflict)0x0) {
    pTVar12 = (PCell)0x0;
  }
  else {
    iVar13 = pTVar12->x;
    if (iVar13 <= iVar8) {
      do {
        pTVar11 = pTVar12;
        if (iVar13 == iVar8) {
          uVar2 = worker->area;
          uVar5 = worker->cover;
          uVar3 = pTVar11->cover;
          uVar6 = pTVar11->area;
          pTVar11->cover = uVar3 + uVar5;
          pTVar11->area = uVar6 + uVar2;
          return;
        }
        pTVar12 = pTVar11->next;
        if (pTVar12 == (PCell)0x0) {
          pTVar12 = (PCell)0x0;
          break;
        }
        iVar13 = pTVar12->x;
      } while (iVar13 <= iVar8);
      ppTVar10 = &pTVar11->next;
    }
  }
  lVar9 = worker->num_cells;
  if (lVar9 < worker->max_cells) {
    worker->num_cells = lVar9 + 1;
    pTVar1 = worker->cells + lVar9;
    pTVar1->x = iVar8;
    uVar4 = worker->area;
    uVar7 = worker->cover;
    pTVar1->cover = uVar7;
    pTVar1->area = uVar4;
    pTVar1->next = pTVar12;
    *ppTVar10 = pTVar1;
    return;
  }
  longjmp((__jmp_buf_tag *)worker,1);
}

Assistant:

static void
  gray_record_cell( RAS_ARG )
  {
    PCell  *pcell, cell;
    TCoord  x = ras.ex;


    pcell = &ras.ycells[ras.ey - ras.min_ey];
    for (;;)
    {
      cell = *pcell;
      if ( !cell || cell->x > x )
        break;

      if ( cell->x == x )
        goto Found;

      pcell = &cell->next;
    }

    if ( ras.num_cells >= ras.max_cells )
      ft_longjmp( ras.jump_buffer, 1 );

    /* insert new cell */
    cell        = ras.cells + ras.num_cells++;
    cell->x     = x;
    cell->area  = ras.area;
    cell->cover = ras.cover;

    cell->next  = *pcell;
    *pcell      = cell;

    return;

  Found:
    /* update old cell */
    cell->area  += ras.area;
    cell->cover += ras.cover;
  }